

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

void BenchmarkFunc<TAvx2Exp<false>,double>
               (vector<double_*,_std::allocator<double_*>_> *inVectors,
               vector<double_*,_std::allocator<double_*>_> *outVectors,size_t vecSize,size_t nIter,
               string *name)

{
  double dVar1;
  pointer ppdVar2;
  double *pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer ppdVar6;
  long lVar7;
  ostream *poVar8;
  runtime_error *this;
  size_t sVar9;
  ulong uVar10;
  vector<double,_std::allocator<double>_> times;
  vector<double,_std::allocator<double>_> local_68;
  string *local_50;
  size_t local_48;
  long local_40;
  double local_38;
  
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_50 = name;
  local_48 = nIter;
  if (nIter != 0) {
    sVar9 = 0;
    do {
      local_40 = std::chrono::_V2::system_clock::now();
      ppdVar6 = (inVectors->super__Vector_base<double_*,_std::allocator<double_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((inVectors->super__Vector_base<double_*,_std::allocator<double_*>_>)._M_impl.
          super__Vector_impl_data._M_finish != ppdVar6) {
        uVar10 = 0;
        do {
          ppdVar2 = (outVectors->super__Vector_base<double_*,_std::allocator<double_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          NFastOps::ExpAvx2<false,false>(ppdVar6[uVar10],vecSize,ppdVar2[uVar10]);
          pdVar3 = ppdVar2[uVar10];
          if (pdVar3 != (double *)0x0) {
            dVar1 = *pdVar3;
            if ((dVar1 == 43432432.0) && (!NAN(dVar1))) {
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this,"requirement outV[0] != 43432432 failed");
              __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          uVar10 = uVar10 + 1;
          ppdVar6 = (inVectors->super__Vector_base<double_*,_std::allocator<double_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar10 < (ulong)((long)(inVectors->
                                        super__Vector_base<double_*,_std::allocator<double_*>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)ppdVar6 >>
                                 3));
      }
      lVar7 = std::chrono::_V2::system_clock::now();
      local_38 = (double)(lVar7 - local_40) / 1000000000.0;
      if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_38);
      }
      else {
        *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_38;
        local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 != local_48);
  }
  pdVar5 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar10 = (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    lVar7 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar4,pdVar5);
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(local_50->_M_dataplus)._M_p,local_50->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
  poVar8 = std::ostream::_M_insert<double>
                     (*local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BenchmarkFunc(const std::vector<T*>& inVectors, std::vector<T*>& outVectors,
                   size_t vecSize, size_t nIter, const std::string& name) {
    std::chrono::high_resolution_clock::time_point t;
    std::vector<double> times;
    for (size_t iterIdx = 0; iterIdx < nIter; ++iterIdx) {
        t = std::chrono::high_resolution_clock::now();
        (void)(iterIdx);
        for (size_t vecIdx = 0; vecIdx < inVectors.size(); ++vecIdx) {
            auto& inV = inVectors[vecIdx];
            auto& outV = outVectors[vecIdx];
            TFunc::Apply(inV, vecSize, outV);
            if (outV && outV[0] == 43432432) {
                throw std::runtime_error("requirement outV[0] != 43432432 failed");
            }
        }
        std::chrono::duration<double> timeSpan = std::chrono::high_resolution_clock::now() - t;
        times.push_back(timeSpan.count());
    }
    std::sort(times.begin(), times.end());
    std::cerr << name << ": " << times[0] << std::endl;
}